

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall cfd::core::Pubkey::Compress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  ByteData local_48;
  undefined1 local_30 [8];
  ByteData compress_data;
  Pubkey *this_local;
  
  compress_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = IsCompress(this);
  if (bVar1) {
    Pubkey(__return_storage_ptr__,this);
  }
  else {
    WallyUtil::CompressPubkey((ByteData *)local_30,&this->data_);
    ByteData::ByteData(&local_48,(ByteData *)local_30);
    Pubkey(__return_storage_ptr__,&local_48);
    ByteData::~ByteData(&local_48);
    ByteData::~ByteData((ByteData *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Compress() const {
  if (IsCompress()) {
    return *this;
  }

  ByteData compress_data = WallyUtil::CompressPubkey(data_);
  return Pubkey(compress_data);
}